

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O3

void __thiscall
anurbs::TrimmedSurfaceClipping::add_curve(TrimmedSurfaceClipping *this,CurveBase<2L> *curve)

{
  pointer *ppIVar1;
  pointer pvVar2;
  iterator __position;
  IntPoint *pIVar3;
  CurveBaseD *in_RDX;
  long lVar4;
  long lVar5;
  IntPoint pt;
  IntPoint local_70;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_60;
  
  pvVar2 = (this->m_paths).
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  CurveTessellation<2L>::compute(&local_60,(CurveTessellation<2L> *)curve,in_RDX,this->m_tolerance);
  if (local_60.second.
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_60.second.
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)local_60.second.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_60.second.
                 super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      local_70.X = (cInt)(*(double *)
                           ((long)((local_60.second.
                                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                                  m_storage.m_data.array + lVar5 + -8) / this->m_scale);
      local_70.Y = (cInt)(*(double *)
                           ((long)((local_60.second.
                                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).
                                  m_storage.m_data.array + lVar5) / this->m_scale);
      __position._M_current =
           pvVar2[-1].
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if ((((lVar4 != 0) ||
           (pIVar3 = *(IntPoint **)(pvVar2 + -1),
           __position._M_current == pIVar3 || (long)__position._M_current - (long)pIVar3 < 0)) ||
          (__position._M_current[-1].X != local_70.X)) ||
         (__position._M_current[-1].Y != local_70.Y)) {
        if (__position._M_current ==
            pvVar2[-1].
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
          _M_realloc_insert<ClipperLib::IntPoint_const&>
                    ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                     (pvVar2 + -1),__position,&local_70);
        }
        else {
          (__position._M_current)->X = local_70.X;
          (__position._M_current)->Y = local_70.Y;
          ppIVar1 = &pvVar2[-1].
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < (long)local_60.second.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_60.second.
                           super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  }
  if (local_60.second.
      super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.second.
                    super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.second.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.second.
                          super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.first.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_curve(CurveBase<2>& curve)
    {
        ClipperLib::Path& path = m_paths.back();

        const auto [ts, points] = CurveTessellation<2>::compute(curve, m_tolerance);

        for (Index i = 0; i < length(points); i++) {
            auto pt = to_int_pt(points[i]);

            if (i == 0 && length(path) > 0 && path.back() == pt) {
                continue;
            }

            path.push_back(pt);
        }
    }